

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O2

bool duckdb::FileSystem::IsRemoteFile(string *path,string *extension)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  undefined1 *puVar4;
  allocator local_79;
  string *local_78;
  string local_70;
  string local_50;
  
  puVar4 = EXTENSION_FILE_PREFIXES;
  lVar1 = 0;
  local_78 = extension;
  do {
    lVar3 = lVar1;
    if (lVar3 == -0x480) goto LAB_017aff9c;
    ::std::__cxx11::string::string((string *)&local_50,(string *)path);
    ::std::__cxx11::string::string((string *)&local_70,puVar4,&local_79);
    bVar2 = StringUtil::StartsWith(&local_50,&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_50);
    puVar4 = puVar4 + 0x60;
    lVar1 = lVar3 + -0x60;
  } while (!bVar2);
  ::std::__cxx11::string::assign((char *)local_78);
LAB_017aff9c:
  return lVar3 != -0x480;
}

Assistant:

bool FileSystem::IsRemoteFile(const string &path, string &extension) {
	for (const auto &entry : EXTENSION_FILE_PREFIXES) {
		if (StringUtil::StartsWith(path, entry.name)) {
			extension = entry.extension;
			return true;
		}
	}
	return false;
}